

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_lower_bounds.cpp
# Opt level: O3

ValuedAction __thiscall
despot::POMCPScenarioLowerBound::Value
          (POMCPScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  POMCPPrior *pPVar1;
  DSPOMDP *pDVar2;
  int iVar3;
  VNode *vnode;
  pointer ppSVar4;
  undefined4 extraout_var;
  ulong uVar5;
  double dVar6;
  ValuedAction VVar7;
  ValuedAction VVar8;
  vector<int,_std::allocator<int>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  pPVar1 = this->prior_;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,&history->actions_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,&history->observations_);
  (*pPVar1->_vptr_POMCPPrior[5])(pPVar1,&local_60);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  vnode = POMCP::CreateVNode(0,*(particles->
                                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                )._M_impl.super__Vector_impl_data._M_start,this->prior_,
                             (this->super_ScenarioLowerBound).model_);
  ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar4) {
    uVar5 = 0;
    do {
      pDVar2 = (this->super_ScenarioLowerBound).model_;
      iVar3 = (*pDVar2->_vptr_DSPOMDP[0x16])(pDVar2,ppSVar4[uVar5]);
      POMCP::Simulate((State *)CONCAT44(extraout_var,iVar3),streams,vnode,
                      (this->super_ScenarioLowerBound).model_,this->prior_);
      pDVar2 = (this->super_ScenarioLowerBound).model_;
      (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,(State *)CONCAT44(extraout_var,iVar3));
      uVar5 = uVar5 + 1;
      ppSVar4 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(particles->
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3)
            );
  }
  VVar7 = POMCP::OptimalAction(vnode);
  VVar8.action = VVar7.action;
  dVar6 = State::Weight(particles);
  if (vnode != (VNode *)0x0) {
    VNode::~VNode(vnode);
  }
  operator_delete(vnode,0x98);
  VVar8._4_4_ = 0;
  VVar8.value = VVar7.value * dVar6;
  return VVar8;
}

Assistant:

ValuedAction POMCPScenarioLowerBound::Value(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	prior_->history(history);
	VNode* root = POMCP::CreateVNode(0, particles[0], prior_, model_);
	// Note that particles are assumed to be of equal weight
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		State* copy = model_->Copy(particle);
		POMCP::Simulate(copy, streams, root, model_, prior_);
		model_->Free(copy);
	}

	ValuedAction va = POMCP::OptimalAction(root);
	va.value *= State::Weight(particles);
	delete root;
	return va;
}